

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiID ImGui::GetKeyOwner(ImGuiKey key)

{
  ImGuiID IVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = key - ImGuiKey_NamedKey_BEGIN;
  if ((uVar4 < 0x9a) ||
     ((uVar2 = key - ImGuiKey_ModCtrl >> 0xc, (key << 0x14 | uVar2) < 8 &&
      ((0x8bU >> (uVar2 & 0x1f) & 1) != 0)))) {
    if (((key & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) &&
       ((uVar2 = key - ImGuiKey_ModCtrl >> 0xc, uVar3 = key << 0x14 | uVar2, uVar3 < 8 &&
        ((0x8bU >> (uVar2 & 0x1f) & 1) != 0)))) {
      key = *(ImGuiKey *)(&DAT_001f6930 + (ulong)uVar3 * 4);
    }
    IVar1 = GImGui->KeysOwnerData[(int)(key - ImGuiKey_NamedKey_BEGIN)].OwnerCurr;
    if ((((GImGui->ActiveIdUsingAllKeyboardKeys != true) || (0x76 < uVar4)) || (IVar1 == 0)) ||
       (IVar1 == GImGui->ActiveId)) {
      return IVar1;
    }
  }
  return 0xffffffff;
}

Assistant:

inline bool             IsNamedKeyOrMod(ImGuiKey key)               { return (key >= ImGuiKey_NamedKey_BEGIN && key < ImGuiKey_NamedKey_END) || key == ImGuiMod_Ctrl || key == ImGuiMod_Shift || key == ImGuiMod_Alt || key == ImGuiMod_Super; }